

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath(ArenaStringPtr *this)

{
  string *this_00;
  ArenaStringPtr *this_local;
  
  this_00 = UnsafeMutablePointer_abi_cxx11_(this);
  if (this_00 != (string *)0x0) {
    std::__cxx11::string::~string((string *)this_00);
    operator_delete(this_00);
  }
  return;
}

Assistant:

void ArenaStringPtr::DestroyNoArenaSlowPath() { delete UnsafeMutablePointer(); }